

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O2

void __thiscall DemoM6502::DrawCode(DemoM6502 *this,int x,int y,int nLines)

{
  uint16_t *__k;
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  int y_00;
  int y_01;
  
  __k = &(this->nes).cpu.pc;
  iVar2 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->mapAsm)._M_t,__k);
  y_00 = ((uint)nLines >> 1) * 10 + y;
  p_Var1 = &(this->mapAsm)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
    olc::PixelGameEngine::DrawString
              (&this->super_PixelGameEngine,x,y_00,(string *)&iVar2._M_node[1]._M_parent,
               (Pixel)olc::CYAN.field_1,1);
    y_01 = y_00;
    while (y_01 < nLines * 10 + y) {
      y_01 = y_01 + 10;
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
      if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
        olc::PixelGameEngine::DrawString
                  (&this->super_PixelGameEngine,x,y_01,(string *)&iVar2._M_node[1]._M_parent,
                   (Pixel)olc::WHITE.field_1,1);
      }
    }
  }
  iVar2 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->mapAsm)._M_t,__k);
  if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
    while (y < y_00) {
      y_00 = y_00 + -10;
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar2._M_node);
      if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
        olc::PixelGameEngine::DrawString
                  (&this->super_PixelGameEngine,x,y_00,(string *)&iVar2._M_node[1]._M_parent,
                   (Pixel)olc::WHITE.field_1,1);
      }
    }
  }
  return;
}

Assistant:

void DrawCode(int x, int y, int nLines)
  {
    auto it_a = mapAsm.find(nes.cpu.pc);
    int nLineY = (nLines >> 1) * 10 + y;
    if (it_a != mapAsm.end())
    {
      DrawString(x, nLineY, (*it_a).second, olc::CYAN);
      while (nLineY < (nLines * 10) + y)
      {
        nLineY += 10;
        if (++it_a != mapAsm.end())
        {
          DrawString(x, nLineY, (*it_a).second);
        }
      }
    }

    it_a = mapAsm.find(nes.cpu.pc);
    nLineY = (nLines >> 1) * 10 + y;
    if (it_a != mapAsm.end())
    {
      while (nLineY > y)
      {
        nLineY -= 10;
        if (--it_a != mapAsm.end())
        {
          DrawString(x, nLineY, (*it_a).second);
        }
      }
    }
  }